

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QMimeType>::reserve(QList<QMimeType> *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QGenericArrayOps<QMimeType> *this_00;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QMimeType> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  QArrayDataPointer<QMimeType> *in_stack_ffffffffffffff60;
  QArrayDataPointer<QMimeType> *in_stack_ffffffffffffff68;
  QArrayDataPointer<QMimeType> *this_01;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QMimeType> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  QArrayDataPointer<QMimeType> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QList<QMimeType> *)0x8e9b45);
  qVar3 = QArrayDataPointer<QMimeType>::freeSpaceAtBegin(in_stack_ffffffffffffff68);
  if (in_RSI <= qVar2 - qVar3) {
    QArrayDataPointer<QMimeType>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QMimeType>::flags(in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_008e9d21;
    QArrayDataPointer<QMimeType>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QMimeType>::isShared(in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<QMimeType>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<QMimeType>::setFlag
                ((QArrayDataPointer<QMimeType> *)0x8e9bff,(ArrayOptions)in_stack_ffffffffffffff5c.i)
      ;
      goto LAB_008e9d21;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QMimeType *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QMimeType> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  this_01 = &local_38;
  QArrayDataPointer<QMimeType>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)this_01 >> 0x20));
  this_00 = (QGenericArrayOps<QMimeType> *)QArrayDataPointer<QMimeType>::operator->(this_01);
  QArrayDataPointer<QMimeType>::operator->(in_RDI);
  QArrayDataPointer<QMimeType>::begin((QArrayDataPointer<QMimeType> *)0x8e9c81);
  QArrayDataPointer<QMimeType>::operator->(in_RDI);
  QArrayDataPointer<QMimeType>::end(in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<QMimeType>::copyAppend
            (this_00,(QMimeType *)this_01,(QMimeType *)in_stack_ffffffffffffff60);
  pDVar4 = QArrayDataPointer<QMimeType>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (QArrayDataPointer<QMimeType> *)QArrayDataPointer<QMimeType>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<QMimeType>::setFlag
              ((QArrayDataPointer<QMimeType> *)0x8e9ce8,(ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<QMimeType>::swap
            (in_stack_ffffffffffffff60,
             (QArrayDataPointer<QMimeType> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<QMimeType>::~QArrayDataPointer(in_stack_ffffffffffffff60);
LAB_008e9d21:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}